

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS
ref_geom_tri_uv_bounding_box2
          (REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_DBL *uv_min,REF_DBL *uv_max)

{
  REF_CELL ref_cell;
  REF_GEOM pRVar1;
  uint uVar2;
  undefined8 uVar3;
  REF_STATUS RVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  undefined1 auVar8 [16];
  REF_INT ncell;
  REF_INT sense;
  REF_INT cells [2];
  REF_DBL uv [2];
  REF_INT nodes [27];
  int local_dc;
  long local_d8;
  REF_GEOM local_d0;
  REF_INT local_c4;
  REF_INT local_c0 [2];
  undefined1 local_b8 [16];
  REF_INT local_a8 [30];
  
  ref_cell = ref_grid->cell[3];
  pRVar1 = ref_grid->geom;
  uVar2 = ref_cell_list_with2(ref_cell,node0,node1,2,&local_dc,local_c0);
  if (uVar2 == 0) {
    if ((long)local_dc == 2) {
      *uv_min = 1e+200;
      uv_min[1] = 1e+200;
      *uv_max = -1e+200;
      uv_max[1] = -1e+200;
      lVar7 = 0;
      local_d0 = pRVar1;
      do {
        uVar2 = ref_cell_nodes(ref_cell,local_c0[lVar7],local_a8);
        if (uVar2 != 0) {
          uVar5 = (ulong)uVar2;
          pcVar6 = "cell nodes";
          uVar3 = 0x5ed;
          goto LAB_00189d15;
        }
        local_d8 = lVar7;
        if (0 < ref_cell->node_per) {
          lVar7 = 0;
          do {
            uVar2 = ref_geom_cell_tuv(local_d0,local_a8[lVar7],local_a8,2,(REF_DBL *)local_b8,
                                      &local_c4);
            if (uVar2 != 0) {
              uVar5 = (ulong)uVar2;
              pcVar6 = "cell uv";
              uVar3 = 0x5f1;
              goto LAB_00189d15;
            }
            auVar8 = minpd(*(undefined1 (*) [16])uv_min,local_b8);
            *(undefined1 (*) [16])uv_min = auVar8;
            auVar8 = maxpd(*(undefined1 (*) [16])uv_max,local_b8);
            *(undefined1 (*) [16])uv_max = auVar8;
            lVar7 = lVar7 + 1;
          } while (lVar7 < ref_cell->node_per);
        }
        lVar7 = local_d8 + 1;
        RVar4 = 0;
      } while (lVar7 < local_dc);
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x5e7,
             "ref_geom_tri_uv_bounding_box2","expected two tri for box2 nodes",2,(long)local_dc);
      RVar4 = 1;
    }
  }
  else {
    uVar5 = (ulong)uVar2;
    pcVar6 = "list";
    uVar3 = 0x5e6;
LAB_00189d15:
    RVar4 = (REF_STATUS)uVar5;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar3,
           "ref_geom_tri_uv_bounding_box2",uVar5,pcVar6);
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tri_uv_bounding_box2(REF_GRID ref_grid,
                                                 REF_INT node0, REF_INT node1,
                                                 REF_DBL *uv_min,
                                                 REF_DBL *uv_max) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT cell, cell_node, iuv;
  REF_DBL uv[2];
  REF_INT i, ncell, cells[2];
  REF_INT sense;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cells), "list");
  REIS(2, ncell, "expected two tri for box2 nodes");

  for (iuv = 0; iuv < 2; iuv++) uv_min[iuv] = REF_DBL_MAX;
  for (iuv = 0; iuv < 2; iuv++) uv_max[iuv] = REF_DBL_MIN;
  for (i = 0; i < ncell; i++) {
    cell = cells[i];
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_geom_cell_tuv(ref_geom, nodes[cell_node], nodes, REF_GEOM_FACE,
                            uv, &sense),
          "cell uv");
      for (iuv = 0; iuv < 2; iuv++) uv_min[iuv] = MIN(uv_min[iuv], uv[iuv]);
      for (iuv = 0; iuv < 2; iuv++) uv_max[iuv] = MAX(uv_max[iuv], uv[iuv]);
    }
  }

  return REF_SUCCESS;
}